

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::ConcurrentAtomicCounterCase::init
          (ConcurrentAtomicCounterCase *this,EVP_PKEY_CTX *ctx)

{
  char *pcVar1;
  pointer pcVar2;
  TestLog *pTVar3;
  RenderContext *pRVar4;
  int iVar5;
  deUint32 err;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined4 extraout_var;
  ShaderProgram *pSVar6;
  TestError *pTVar7;
  long lVar8;
  ScopedLogSection section;
  vector<unsigned_int,_std::allocator<unsigned_int>_> zeroData;
  ScopedLogSection local_168;
  undefined1 local_160 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  string local_138;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_118;
  undefined1 local_100 [144];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_70;
  undefined1 local_50 [32];
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar5);
  local_100._0_8_ = (ulong)(uint)local_100._4_4_ << 0x20;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_118,(long)(this->m_workSize * this->m_numCalls),
             (value_type_conflict2 *)local_100,(allocator_type *)local_160);
  (**(code **)(lVar8 + 0x6c8))(1,&this->m_counterBuffer);
  (**(code **)(lVar8 + 0x40))(0x90d2,this->m_counterBuffer);
  (**(code **)(lVar8 + 0x150))
            (0x90d2,4,local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,0x88ea);
  (**(code **)(lVar8 + 0x6c8))(1,&this->m_intermediateResultBuffer);
  (**(code **)(lVar8 + 0x40))(0x90d2,this->m_intermediateResultBuffer);
  (**(code **)(lVar8 + 0x150))
            (0x90d2,(long)this->m_workSize * (long)this->m_numCalls * 4,
             local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,0x88ea);
  err = (**(code **)(lVar8 + 0x800))();
  glu::checkError(err,"gen buffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0x97b);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_100._0_8_ = local_100 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"EvenProgram","");
  local_160._0_8_ = &local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"Even program","");
  tcu::ScopedLogSection::ScopedLogSection(&local_168,pTVar3,(string *)local_100,(string *)local_160)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._0_8_ != &local_150) {
    operator_delete((void *)local_160._0_8_,local_150._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
    operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
  }
  pSVar6 = (ShaderProgram *)operator_new(0xd0);
  pRVar4 = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(local_100,0,0xac);
  local_50._0_8_ = (pointer)0x0;
  local_50[8] = 0;
  local_50._9_7_ = 0;
  local_50[0x10] = 0;
  local_50._17_8_ = 0;
  (anonymous_namespace)::ConcurrentAtomicCounterCase::genComputeSource_abi_cxx11_
            (&local_138,this,true);
  local_160._0_4_ = 5;
  pcVar1 = local_150._M_local_buf + 8;
  local_160._8_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_160 + 8),local_138._M_dataplus._M_p,
             local_138._M_dataplus._M_p + local_138._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + (local_160._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_160 + 8));
  glu::ShaderProgram::ShaderProgram(pSVar6,pRVar4,(ProgramSources *)local_100);
  this->m_evenProgram = pSVar6;
  pcVar2 = local_100 + 0x10;
  if ((char *)local_160._8_8_ != pcVar1) {
    operator_delete((void *)local_160._8_8_,local_150._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_70);
  lVar8 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + lVar8));
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_evenProgram);
  if ((this->m_evenProgram->m_program).m_info.linkOk != false) {
    tcu::TestLog::endSection(local_168.m_log);
    pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_100._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"OddProgram","");
    local_160._0_8_ = &local_150;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"Odd program","");
    tcu::ScopedLogSection::ScopedLogSection
              (&local_168,pTVar3,(string *)local_100,(string *)local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._0_8_ != &local_150) {
      operator_delete((void *)local_160._0_8_,local_150._M_allocated_capacity + 1);
    }
    if ((pointer)local_100._0_8_ != pcVar2) {
      operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
    }
    pSVar6 = (ShaderProgram *)operator_new(0xd0);
    pRVar4 = ((this->super_TestCase).m_context)->m_renderCtx;
    memset(local_100,0,0xac);
    local_50._0_8_ = (pointer)0x0;
    local_50[8] = 0;
    local_50._9_7_ = 0;
    local_50[0x10] = 0;
    local_50._17_8_ = 0;
    (anonymous_namespace)::ConcurrentAtomicCounterCase::genComputeSource_abi_cxx11_
              (&local_138,this,false);
    local_160._0_4_ = 5;
    local_160._8_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_160 + 8),local_138._M_dataplus._M_p,
               local_138._M_dataplus._M_p + local_138._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_100 + (local_160._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_160 + 8)
               );
    glu::ShaderProgram::ShaderProgram(pSVar6,pRVar4,(ProgramSources *)local_100);
    this->m_oddProgram = pSVar6;
    if ((char *)local_160._8_8_ != pcVar1) {
      operator_delete((void *)local_160._8_8_,local_150._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_50);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_70);
    lVar8 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_100 + lVar8));
      lVar8 = lVar8 + -0x18;
    } while (lVar8 != -0x18);
    glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                    this->m_oddProgram);
    if ((this->m_oddProgram->m_program).m_info.linkOk != false) {
      tcu::TestLog::endSection(local_168.m_log);
      iVar5 = extraout_EAX;
      if (local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_118.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_118.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        iVar5 = extraout_EAX_00;
      }
      return iVar5;
    }
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    local_100._0_8_ = local_100 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_100,"could not build program","");
    tcu::TestError::TestError(pTVar7,(string *)local_100);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
  local_100._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"could not build program","");
  tcu::TestError::TestError(pTVar7,(string *)local_100);
  __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ConcurrentAtomicCounterCase::init (void)
{
	const glw::Functions&		gl			= m_context.getRenderContext().getFunctions();
	const std::vector<deUint32>	zeroData	(m_numCalls * m_workSize, 0);

	// gen buffer

	gl.genBuffers(1, &m_counterBuffer);
	gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_counterBuffer);
	gl.bufferData(GL_SHADER_STORAGE_BUFFER, sizeof(deUint32), &zeroData[0], GL_DYNAMIC_COPY);

	gl.genBuffers(1, &m_intermediateResultBuffer);
	gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_intermediateResultBuffer);
	gl.bufferData(GL_SHADER_STORAGE_BUFFER, sizeof(deUint32) * m_numCalls * m_workSize, &zeroData[0], GL_DYNAMIC_COPY);

	GLU_EXPECT_NO_ERROR(gl.getError(), "gen buffers");

	// gen programs

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "EvenProgram", "Even program");

		m_evenProgram = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(genComputeSource(true)));
		m_testCtx.getLog() << *m_evenProgram;
		if (!m_evenProgram->isOk())
			throw tcu::TestError("could not build program");
	}
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "OddProgram", "Odd program");

		m_oddProgram = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(genComputeSource(false)));
		m_testCtx.getLog() << *m_oddProgram;
		if (!m_oddProgram->isOk())
			throw tcu::TestError("could not build program");
	}
}